

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_sort(adt_ary_t *self,adt_vlt_func_t *key,_Bool reverse)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  void **ppvVar6;
  long lVar7;
  adt_error_t aVar8;
  ulong uVar9;
  long lVar10;
  long local_58;
  
  aVar8 = '\x01';
  if (key != (adt_vlt_func_t *)0x0 && self != (adt_ary_t *)0x0) {
    iVar1 = self->s32CurLen;
    if (1 < iVar1) {
      lVar10 = 1;
      local_58 = 0;
      for (uVar5 = 0; uVar5 != iVar1 - 1; uVar5 = uVar5 + 1) {
        pvVar2 = self->pFirst[lVar10 + -1];
        pvVar3 = self->pFirst[lVar10];
        uVar4 = (*key)(pvVar2,pvVar3);
        if ((int)uVar4 < 0) {
          return '\b';
        }
        if (reverse) {
          uVar4 = (uint)(uVar4 == 0);
        }
        if (uVar4 == 0) {
          self->pFirst[lVar10] = pvVar2;
          lVar7 = local_58;
          for (uVar9 = uVar5; ppvVar6 = self->pFirst, 0 < (long)uVar9; uVar9 = uVar9 - 1) {
            pvVar2 = *(void **)((long)ppvVar6 + lVar7 + -8);
            uVar4 = (*key)(pvVar2,pvVar3);
            if ((int)uVar4 < 0) {
              return '\b';
            }
            if (reverse) {
              uVar4 = (uint)(uVar4 == 0);
            }
            if (uVar4 != 0) {
              ppvVar6 = (void **)((long)self->pFirst + lVar7);
              break;
            }
            *(void **)((long)self->pFirst + lVar7) = pvVar2;
            lVar7 = lVar7 + -8;
          }
          *ppvVar6 = pvVar3;
        }
        lVar10 = lVar10 + 1;
        local_58 = local_58 + 8;
      }
    }
    aVar8 = '\0';
  }
  return aVar8;
}

Assistant:

adt_error_t adt_ary_sort(adt_ary_t *self, adt_vlt_func_t *key, bool reverse)
{
   if ( (self == 0) || (key == 0) )
   {
      return ADT_INVALID_ARGUMENT_ERROR;
   }
   ///TODO: For now we simply use insertion sort. Will need to implement Timsort later on.
   return adt_ary_insertion_sort(self, key, reverse);
}